

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GetObjectConstructor
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          string *data_buffer,string *offset)

{
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *offset_local;
  string *data_buffer_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  local_30 = offset;
  offset_local = data_buffer;
  data_buffer_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  Name_abi_cxx11_(&local_f0,this,&struct_def->super_Definition);
  std::operator+(&local_d0,"new ",&local_f0);
  std::operator+(&local_b0,&local_d0,"().__assign(");
  std::operator+(&local_90,&local_b0,local_30);
  std::operator+(&local_70,&local_90,", ");
  std::operator+(&local_50,&local_70,offset_local);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string GetObjectConstructor(flatbuffers::StructDef &struct_def,
                                   const std::string &data_buffer,
                                   const std::string &offset) const {
    // Use the generated type directly, to properly handle default values that
    // might not be written to the buffer.
    return "new " + Name(struct_def) + "().__assign(" + offset + ", " +
           data_buffer + ")";
  }